

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

bool __thiscall
tsbp::LeftmostActiveOnly::IsPlacementFeasible
          (LeftmostActiveOnly *this,Packing2D *packing,Rectangle *itemToPlace)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = packing->ActiveX;
  uVar2 = (ulong)iVar1;
  if (itemToPlace->Dx + iVar1 <= (this->container).super_Rectangle.Dx) {
    uVar3 = (ulong)packing->ActiveY;
    uVar4 = (long)itemToPlace->Dy + uVar3;
    if ((((int)(uint)uVar4 <= (this->container).super_Rectangle.Dy) &&
        ((*(ulong *)(*(long *)&(this->itemSpecificPlacementPointsX).
                               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[itemToPlace->InternId].
                               m_bits.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0)) &&
       ((*(ulong *)(*(long *)&(this->itemSpecificPlacementPointsY).
                              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[itemToPlace->InternId].
                              m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
      if (((iVar1 != packing->AbscissaMaxX) ||
          (bVar5 = true, packing->AbscissaMaxX != packing->MaxX)) &&
         (bVar5 = (uint)uVar4 <= (uint)packing->ActiveY, !bVar5)) {
        do {
          if (uVar2 < (packing->PlacedAreaVector).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar3]) {
            return false;
          }
          uVar3 = uVar3 + 1;
          bVar5 = uVar3 >= uVar4;
        } while (uVar3 < uVar4);
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool LeftmostActiveOnly::IsPlacementFeasible(Packing2D& packing, const Rectangle& itemToPlace)
{
    if (packing.ActiveX + itemToPlace.Dx > this->container.Dx || packing.ActiveY + itemToPlace.Dy > this->container.Dy)
    {
        return false;
    }

    if (!(this->itemSpecificPlacementPointsX[itemToPlace.InternId][packing.ActiveX] && this->itemSpecificPlacementPointsY[itemToPlace.InternId][packing.ActiveY]))
    {
        return false;
    }

    if (packing.AbscissaMaxX == packing.MaxX && packing.ActiveX == packing.AbscissaMaxX)
    {
        return true;
    }

    size_t minY = packing.ActiveY;
    size_t maxY = packing.ActiveY + itemToPlace.Dy;

    for (size_t y = minY; y < maxY; y++)
    {
        size_t x = packing.PlacedAreaVector[y];

        if (x > packing.ActiveX)
        {
            return false;
        }
    }

    return true;

    /*
    // Checking intersections/crossing with boost geometry is about 18% slower than the manual overlap check below.
    typedef bg::model::point<int, 2, bg::cs::cartesian> Point2D;
    typedef bg::model::linestring<Point2D> Linestring2D;

    // Checking for crossing only with the west edge will not always produce expected true/false values. Need to add north and east edge as well.
    Linestring2D newRectangleWestEdge{ { packing.ActiveX, packing.ActiveY }, { packing.ActiveX, packing.ActiveY + item.Dy }, { packing.ActiveX + item.Dx, packing.ActiveY + item.Dy }, { packing.ActiveX + item.Dx, packing.ActiveY } };

    const bool isCrossing = boost::geometry::crosses(newRectangleWestEdge, packing.Layout.DeactivatedArea);
    if (isCrossing)
    {
        return false;
    }
    */

    /*
    // Naive overlap check. Worse performance than current solution.
    for (const Rectangle& rectangle : packing.Layout.Items)
    {
        // overlapDx > 0 && overlapDy > 0
        if (std::min(rectangle.X + rectangle.Dx, packing.ActiveX + item.Dx) - std::max(rectangle.X, packing.ActiveX) > 0
            && std::min(rectangle.Y + rectangle.Dy, packing.ActiveY + item.Dy) - std::max(rectangle.Y, packing.ActiveY) > 0)
        {
            return false;
        }
    }
    */
}